

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

bool tcu::isAccessValid(TextureFormat format,TextureAccessType type)

{
  undefined4 uStack_14;
  TextureAccessType type_local;
  TextureFormat format_local;
  
  uStack_14 = format.order;
  if (uStack_14 == DS) {
    format_local.order._3_1_ = R >> 0x18;
  }
  else if (uStack_14 == D) {
    format_local.order._3_1_ = type == TEXTUREACCESSTYPE_FLOAT;
  }
  else if (uStack_14 == S) {
    format_local.order._3_1_ = type == TEXTUREACCESSTYPE_UNSIGNED_INT;
  }
  else {
    type_local = format.type;
    if ((type_local == 0x16) || (type_local == 0x17)) {
      format_local.order._3_1_ = type == TEXTUREACCESSTYPE_FLOAT;
    }
    else {
      format_local.order._3_1_ = 1;
    }
  }
  return (bool)format_local.order._3_1_;
}

Assistant:

bool isAccessValid (TextureFormat format, TextureAccessType type)
{
	DE_ASSERT(isValid(format));

	if (format.order == TextureFormat::DS)
	{
		// It is never allowed to access combined depth-stencil format with getPixel().
		// Instead either getPixDepth() or getPixStencil(), or effective depth- or stencil-
		// access must be used.
		return false;
	}
	else if (format.order == TextureFormat::D)
		return type == TEXTUREACCESSTYPE_FLOAT;
	else if (format.order == TextureFormat::S)
		return type == TEXTUREACCESSTYPE_UNSIGNED_INT;
	else
	{
		// A few packed color formats have access type restrictions
		if (format.type == TextureFormat::UNSIGNED_INT_11F_11F_10F_REV ||
			format.type == TextureFormat::UNSIGNED_INT_999_E5_REV)
			return type == TEXTUREACCESSTYPE_FLOAT;
		else
			return true;
	}
}